

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceVisitor.hpp
# Opt level: O0

void __thiscall netlist::InstanceVisitor::handle(InstanceVisitor *this,InstanceSymbol *symbol)

{
  bool bVar1;
  InstanceVisitor *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  InstanceSymbol *in_stack_00000438;
  InstanceVisitor *in_stack_00000440;
  char *in_stack_ffffffffffffffa8;
  InstanceVisitor *visitor;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  InstanceSymbol *in_stack_ffffffffffffffd8;
  InstanceVisitor *in_stack_ffffffffffffffe0;
  InstanceSymbol *in_stack_ffffffffffffffe8;
  
  visitor = (InstanceVisitor *)&stack0xffffffffffffffd0;
  slang::ast::Symbol::getHierarchicalPath_abi_cxx11_((Symbol *)in_stack_ffffffffffffffd8);
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffa8);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(in_RDI);
  if ((uVar2 & 0x1000000) == 0) {
    handleInstanceMemberVars(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    handleInstanceMemberPorts(in_RSI,in_stack_ffffffffffffffe8);
    handleInstanceExtPorts(in_stack_00000440,in_stack_00000438);
    slang::ast::Symbol::visit<netlist::InstanceVisitor&>
              ((Symbol *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),visitor);
  }
  return;
}

Assistant:

void handle(const ast::InstanceSymbol& symbol) {
        DEBUG_PRINT("Instance: {}\n", symbol.getHierarchicalPath());

        if (symbol.getHierarchicalPath() == "$unit") {
            // An instance without a name has been excluded from the design.
            // This can happen when the --top option is used and there is an
            // uninstanced module.
            return;
        }

        handleInstanceMemberVars(symbol);
        handleInstanceMemberPorts(symbol);
        handleInstanceExtPorts(symbol);

        symbol.body.visit(*this);
    }